

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::queryTest<false>(ViewTest *this)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_01;
  size_t sVar1;
  int *data;
  allocator_type aVar2;
  allocator_type local_69;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            (&v,&this->scalar_,(allocator_type *)&shape);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = sVar1 == 0 && v.geometry_.size_ == 1;
  test((bool *)&shape);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin._M_current = 0x18;
  data = this->data_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_69);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  local_69 = (allocator_type)0x0;
  if ((sVar1 == 1) && (local_69 = (allocator_type)0x0, v.geometry_.size_ == 0x18)) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,0);
    local_69 = (allocator_type)(sVar1 == 0x18);
  }
  test((bool *)&local_69);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  begin_00._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_00._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_00._M_current = 4;
  begin_00._M_current[1] = 6;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_69);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  aVar2 = (allocator_type)0x0;
  if ((sVar1 == 2) && (aVar2 = (allocator_type)0x0, v.geometry_.size_ == 0x18)) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,0);
    if (sVar1 == 4) {
      sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,1);
      aVar2 = (allocator_type)(sVar1 == 6);
    }
    else {
      aVar2 = (allocator_type)0x0;
    }
  }
  local_69 = aVar2;
  test((bool *)&local_69);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  begin_01._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_01._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_01._M_current = 3;
  begin_01._M_current[1] = 4;
  begin_01._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_01,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             &local_69);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
  aVar2 = (allocator_type)0x0;
  if ((sVar1 == 3) && (v.geometry_.size_ == 0x18)) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,0);
    if (sVar1 == 3) {
      sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,1);
      if (sVar1 == 4) {
        sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape(&v,2);
        aVar2 = (allocator_type)(sVar1 == 2);
        goto LAB_00173b1c;
      }
    }
    aVar2 = (allocator_type)0x0;
  }
LAB_00173b1c:
  local_69 = aVar2;
  test((bool *)&local_69);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void ViewTest::queryTest(){
    // scalar
    {
        andres::View<int, constTarget> v(&scalar_);
        test(v.dimension()== 0 &&
               v.size()== 1);
    }
    // 1D
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

        test(v.dimension()==1 && 
               v.size()==24 &&
               v.shape(0)==24);
    }
    // 2D 
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 4;
        shape[1] = 6; 
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

        test(v.dimension()== 2 &&
               v.size()== 24 &&
               v.shape(0)== 4 &&
               v.shape(1)== 6); 
    }
    // 3D
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4;
        shape[2] = 2;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

        test(v.dimension()== 3 &&
               v.size()== 24 && 
               v.shape(0)== 3 && 
               v.shape(1)== 4 &&
               v.shape(2)== 2);
    }
}